

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection_p.h
# Opt level: O2

QHttp2Stream * __thiscall QHttp2Connection::promisedStream(QHttp2Connection *this,QUrl *streamKey)

{
  QHttp2Stream *pQVar1;
  long in_FS_OFFSET;
  quint32 id;
  QWeakPointer<QObject> local_30;
  uint local_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_30.d._0_4_ = 0;
  local_1c = QHash<QUrl,_unsigned_int>::value
                       ((QHash<QUrl,_unsigned_int> *)(this + 0x1d0),streamKey,(uint *)&local_30);
  if (local_1c == 0) {
    pQVar1 = (QHttp2Stream *)0x0;
  }
  else {
    QHash<unsigned_int,_QPointer<QHttp2Stream>_>::value
              ((QHash<unsigned_int,_QPointer<QHttp2Stream>_> *)&local_30,(uint *)(this + 0x1c0));
    if ((CONCAT44(local_30.d._4_4_,local_30.d._0_4_) == 0) ||
       (pQVar1 = (QHttp2Stream *)local_30.value,
       *(int *)(CONCAT44(local_30.d._4_4_,local_30.d._0_4_) + 4) == 0)) {
      pQVar1 = (QHttp2Stream *)0x0;
    }
    QWeakPointer<QObject>::~QWeakPointer(&local_30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return pQVar1;
}

Assistant:

QHttp2Stream *promisedStream(const QUrl &streamKey) const
    {
        if (quint32 id = m_promisedStreams.value(streamKey, 0); id)
            return m_streams.value(id);
        return nullptr;
    }